

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

plutovg_path_t * plutovg_path_clone(plutovg_path_t *path)

{
  int iVar1;
  int iVar2;
  int iVar3;
  plutovg_path_t *ppVar4;
  plutovg_path_element_t *ppVar5;
  int iVar6;
  
  ppVar4 = (plutovg_path_t *)malloc(0x28);
  ppVar4->ref_count = 1;
  ppVar4->num_points = 0;
  ppVar4->num_contours = 0;
  ppVar4->num_curves = 0;
  (ppVar4->start_point).x = 0.0;
  *(undefined8 *)&(ppVar4->start_point).y = 0;
  *(undefined8 *)((long)&(ppVar4->elements).data + 4) = 0;
  (ppVar4->elements).capacity = 0;
  if (((path->elements).data != (plutovg_path_element_t *)0x0) &&
     (iVar3 = (path->elements).size, 0 < iVar3)) {
    iVar1 = (ppVar4->elements).size;
    iVar3 = iVar3 + iVar1;
    iVar6 = (ppVar4->elements).capacity;
    if (iVar6 < iVar3) {
      iVar2 = 8;
      if (iVar6 != 0) {
        iVar2 = iVar6;
      }
      do {
        iVar6 = iVar2;
        iVar2 = iVar6 * 2;
      } while (iVar6 < iVar3);
      ppVar5 = (plutovg_path_element_t *)realloc((ppVar4->elements).data,(long)iVar6 << 3);
      (ppVar4->elements).data = ppVar5;
      (ppVar4->elements).capacity = iVar6;
    }
    memcpy((ppVar4->elements).data + iVar1,(path->elements).data,(long)(path->elements).size << 3);
    (ppVar4->elements).size = (path->elements).size + iVar1;
  }
  ppVar4->start_point = path->start_point;
  ppVar4->num_points = path->num_points;
  ppVar4->num_contours = path->num_contours;
  ppVar4->num_curves = path->num_curves;
  return ppVar4;
}

Assistant:

plutovg_path_t* plutovg_path_clone(const plutovg_path_t* path)
{
    plutovg_path_t* clone = plutovg_path_create();
    plutovg_array_append(clone->elements, path->elements);
    clone->start_point = path->start_point;
    clone->num_points = path->num_points;
    clone->num_contours = path->num_contours;
    clone->num_curves = path->num_curves;
    return clone;
}